

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_upto_last_wal_flush_bid_check(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t sVar2;
  int opt;
  ulong uVar3;
  char *__format;
  uint uVar4;
  ulong uVar5;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers_out;
  uint64_t num_markers;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char keybuf [256];
  char valuebuf [512];
  fdb_file_handle *local_478;
  fdb_snapshot_info_t *local_470;
  uint64_t local_468;
  fdb_kvs_handle *local_460;
  fdb_kvs_config local_458;
  timeval local_440;
  fdb_config local_430;
  char local_338 [256];
  char local_238 [520];
  
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  local_430.num_keeping_headers = 0x14;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&local_478,"compact_test",&local_430);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open(local_478,&local_460,"db",&local_458);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114316;
    memset(local_238,0x78,200);
    uVar3 = 0;
    do {
      uVar5 = 0;
      do {
        sprintf(local_338,"k%06d",uVar5);
        sprintf(local_238,"v%d_%04d",uVar3,uVar5);
        handle = local_460;
        sVar2 = strlen(local_338);
        fVar1 = fdb_set_kv(handle,local_338,sVar2 + 1,local_238,200);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          compact_upto_last_wal_flush_bid_check();
          goto LAB_0011430c;
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 1000);
      fVar1 = fdb_commit(local_478,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011430c:
        compact_upto_last_wal_flush_bid_check();
        goto LAB_00114311;
      }
      uVar4 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar4;
    } while (uVar4 != 0x14);
    fVar1 = fdb_get_all_snap_markers(local_478,&local_470,&local_468);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011431b;
    fVar1 = fdb_compact_upto(local_478,"compact_test2",local_470[0xf].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114320;
    fdb_free_snap_markers(local_470,local_468);
    fVar1 = fdb_get_all_snap_markers(local_478,&local_470,&local_468);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114325;
    fVar1 = fdb_compact_upto(local_478,"compact_test3",local_470[0xf].marker);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_free_snap_markers(local_470,local_468);
      fVar1 = fdb_close(local_478);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (compact_upto_last_wal_flush_bid_check()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"compact upto last WAL flush bid check test");
        return;
      }
      goto LAB_0011432f;
    }
  }
  else {
LAB_00114311:
    compact_upto_last_wal_flush_bid_check();
LAB_00114316:
    compact_upto_last_wal_flush_bid_check();
LAB_0011431b:
    compact_upto_last_wal_flush_bid_check();
LAB_00114320:
    compact_upto_last_wal_flush_bid_check();
LAB_00114325:
    compact_upto_last_wal_flush_bid_check();
  }
  compact_upto_last_wal_flush_bid_check();
LAB_0011432f:
  compact_upto_last_wal_flush_bid_check();
  compact_deleted_doc_test();
  opt = 0;
  compact_upto_test(false);
  compact_upto_test(true);
  compact_upto_last_wal_flush_bid_check();
  wal_delete_compact_upto_test();
  compact_upto_with_circular_reuse_test();
  do {
    compact_upto_overwrite_test(opt);
    opt = opt + 1;
  } while (opt != 4);
  compact_with_snapshot_open_multi_kvs_test();
  compact_with_snapshot_open_test();
  compact_upto_post_snapshot_test();
  compact_upto_twice_test();
  compaction_callback_test(true);
  compaction_callback_test(false);
  compact_wo_reopen_test();
  compact_with_reopen_test();
  compact_reopen_with_iterator();
  compact_reopen_named_kvs();
  estimate_space_upto_test(false);
  estimate_space_upto_test(true);
  unlink_after_compaction_test();
  db_compact_overwrite();
  db_compact_during_doc_delete((void *)0x0);
  compaction_with_concurrent_transaction_test();
  compaction_with_concurrent_update_test();
  auto_compaction_with_custom_cmp_function();
  compaction_daemon_test(0x14);
  auto_compaction_with_concurrent_insert_test(0x14);
  compaction_cancellation_test(COMPACTION_CANCEL_MODE);
  return;
}

Assistant:

void compact_upto_last_wal_flush_bid_check()
{
    TEST_INIT();
    int i, j;
    int r;
    int ndocs=1000;
    int ncommit=20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.num_keeping_headers = 20;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 200);
    for (i=0; i<ncommit; ++i) {
        for (j=0; j<ndocs; ++j) {
            sprintf(keybuf, "k%06d", j);
            sprintf(valuebuf, "v%d_%04d", i, j);
            s = fdb_set_kv(db, keybuf, strlen(keybuf)+1, valuebuf, 200);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // compact_upto() will copy DB headers to be kept
    s = fdb_compact_upto(dbfile, "compact_test2", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // call compact_upto() again
    // copying the previous DB headers should be done correctly.
    s = fdb_compact_upto(dbfile, "compact_test3", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    memleak_end();

    TEST_RESULT("compact upto last WAL flush bid check test");
}